

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

char * pathsearch(char *argv0,char *name,int modemask)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  char *str;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  char *__s;
  
  pcVar3 = strrchr(argv0,0x2f);
  if (pcVar3 == (char *)0x0) {
    pcVar6 = getenv("PATH");
    pcVar3 = ".:/bin:/usr/bin";
    if (pcVar6 != (char *)0x0) {
      pcVar3 = pcVar6;
    }
    sVar4 = strlen(pcVar3);
    pcVar7 = (char *)malloc((long)((int)sVar4 + 1));
    sVar5 = strlen(name);
    str = (char *)malloc((long)(((ulong)(uint)((int)sVar4 + (int)sVar5) << 0x20) + 0x200000000) >>
                         0x20);
    pcVar6 = (char *)0x0;
    if ((pcVar7 != (char *)0x0) && (str != (char *)0x0)) {
      lVar8 = 0;
      do {
        cVar1 = pcVar3[lVar8];
        pcVar7[lVar8] = cVar1;
        lVar8 = lVar8 + 1;
        __s = pcVar7;
      } while (cVar1 != '\0');
      do {
        pcVar6 = pcVar7;
        if (*__s == '\0') break;
        pcVar3 = strchr(__s,0x3a);
        if (pcVar3 == (char *)0x0) {
          sVar4 = strlen(__s);
          pcVar3 = __s + (int)sVar4;
        }
        cVar1 = *pcVar3;
        *pcVar3 = '\0';
        lemon_sprintf(str,"%s/%s",__s,name);
        *pcVar3 = cVar1;
        if (cVar1 == '\0') {
          *__s = '\0';
        }
        else {
          __s = pcVar3 + 1;
        }
        iVar2 = access(str,modemask);
      } while (iVar2 != 0);
    }
    free(pcVar6);
  }
  else {
    cVar1 = *pcVar3;
    *pcVar3 = '\0';
    sVar4 = strlen(argv0);
    sVar5 = strlen(name);
    str = (char *)malloc((long)(((ulong)(uint)((int)sVar4 + (int)sVar5) << 0x20) + 0x200000000) >>
                         0x20);
    if (str != (char *)0x0) {
      lemon_sprintf(str,"%s/%s",argv0,name);
    }
    *pcVar3 = cVar1;
  }
  return str;
}

Assistant:

PRIVATE char *pathsearch(char *argv0, char *name, int modemask)
{
  const char *pathlist;
  char *pathbufptr = 0;
  char *pathbuf = 0;
  char *path,*cp;
  char c;

#ifdef __WIN32__
  cp = strrchr(argv0,'\\');
#else
  cp = strrchr(argv0,'/');
#endif
  if( cp ){
    c = *cp;
    *cp = 0;
    path = (char *)malloc( lemonStrlen(argv0) + lemonStrlen(name) + 2 );
    if( path ) lemon_sprintf(path,"%s/%s",argv0,name);
    *cp = c;
  }else{
    pathlist = getenv("PATH");
    if( pathlist==0 ) pathlist = ".:/bin:/usr/bin";
    pathbuf = (char *) malloc( lemonStrlen(pathlist) + 1 );
    path = (char *)malloc( lemonStrlen(pathlist)+lemonStrlen(name)+2 );
    if( (pathbuf != 0) && (path!=0) ){
      pathbufptr = pathbuf;
      lemon_strcpy(pathbuf, pathlist);
      while( *pathbuf ){
        cp = strchr(pathbuf,':');
        if( cp==0 ) cp = &pathbuf[lemonStrlen(pathbuf)];
        c = *cp;
        *cp = 0;
        lemon_sprintf(path,"%s/%s",pathbuf,name);
        *cp = c;
        if( c==0 ) pathbuf[0] = 0;
        else pathbuf = &cp[1];
        if( access(path,modemask)==0 ) break;
      }
    }
    free(pathbufptr);
  }
  return path;
}